

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-object.c
# Opt level: O0

void display_object_kind_recall(object_kind *kind)

{
  undefined1 local_2a0 [8];
  object known_obj;
  object object;
  object_kind *kind_local;
  
  memcpy(&known_obj.note,&DAT_002bb730,0x148);
  memcpy(local_2a0,&DAT_002bb878,0x148);
  object_prep((object *)&known_obj.note,kind,L'\0',EXTREMIFY);
  if (((kind->aware & 1U) != 0) || (kind->flavor == (flavor *)0x0)) {
    object_copy((object *)local_2a0,(object *)&known_obj.note);
  }
  display_object_recall((object *)&known_obj.note);
  object_wipe((object *)local_2a0);
  object_wipe((object *)&known_obj.note);
  return;
}

Assistant:

void display_object_kind_recall(struct object_kind *kind)
{
	struct object object = OBJECT_NULL, known_obj = OBJECT_NULL;
	object_prep(&object, kind, 0, EXTREMIFY);
	if (kind->aware || !kind->flavor) {
		object_copy(&known_obj, &object);
	}
	object.known = &known_obj;

	display_object_recall(&object);
	object_wipe(&known_obj);
	object_wipe(&object);
}